

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivMark(Gia_Man_t *p,char *pFileName,int fSkipSome,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  Vec_Int_t *vTrace_00;
  Gia_Man_t *p_01;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint local_5c;
  Vec_Int_t *vTrace;
  ulong local_38;
  
  uVar1 = Gia_ManEquivCountLitsAll(p);
  if (uVar1 == 0) {
    Abc_Print(1,"Gia_ManEquivMark(): Current AIG does not have equivalences.\n");
    return;
  }
  p_00 = Gia_AigerRead(pFileName,0,0,0);
  if (p_00 == (Gia_Man_t *)0x0) {
    Abc_Print(1,"Gia_ManEquivMark(): Input file %s could not be read.\n",pFileName);
    return;
  }
  if (fSkipSome == 0) {
    uVar5 = p_00->vCos->nSize - p_00->nRegs;
    uVar6 = p->vCos->nSize - p->nRegs;
    if (uVar5 != uVar6 + uVar1) {
      Abc_Print(1,
                "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGEquivNum(%d).\n"
                ,(ulong)uVar5,(ulong)uVar6,(ulong)uVar1);
      goto LAB_001e7f35;
    }
    uVar6 = 0;
    local_5c = 0;
    for (lVar7 = 0; lVar7 < p->nObjs; lVar7 = lVar7 + 1) {
      if ((~(uint)p->pReprs[lVar7] & 0xfffffff) != 0) {
        uVar5 = uVar6 + 1;
        pGVar4 = Gia_ManPo(p_00,(uVar6 + p->vCos->nSize) - p->nRegs);
        iVar8 = Gia_ObjFaninLit0p(p_00,pGVar4);
        uVar6 = uVar5;
        if (iVar8 == 0) {
          p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0x10000000);
          local_5c = local_5c + 1;
        }
      }
    }
    if (uVar6 != uVar1) {
      __assert_fail("nLits == nLitsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x63f,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
    }
  }
  else {
    vTrace_00 = Vec_IntAlloc(100);
    iVar8 = 0;
    vTrace = vTrace_00;
    p_01 = Gia_ManSpecReduceTrace(p,vTrace_00,(Vec_Int_t *)0x0);
    Gia_ManStop(p_01);
    if (vTrace_00->nSize != uVar1) {
      __assert_fail("Vec_IntSize(vTrace) == nLitsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x607,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
    }
    uVar6 = 0;
    local_38 = (ulong)uVar1;
    for (; iVar8 < (int)uVar1; iVar8 = iVar8 + 1) {
      iVar2 = Vec_IntEntry(vTrace_00,iVar8);
      uVar6 = (uVar6 + 1) - (uint)(iVar2 == 0);
      uVar1 = vTrace_00->nSize;
    }
    uVar5 = p_00->vCos->nSize - p_00->nRegs;
    uVar1 = p->vCos->nSize - p->nRegs;
    if (uVar5 != uVar1 + uVar6) {
      Abc_Print(1,
                "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGFilteredEquivNum(%d).\n"
                ,(ulong)uVar5,(ulong)uVar1,(ulong)uVar6);
      Gia_ManStop(p_00);
      Vec_IntFreeP(&vTrace);
      return;
    }
    uVar1 = 0;
    iVar8 = 0;
    local_5c = 0;
    for (lVar7 = 0; lVar7 < p->nObjs; lVar7 = lVar7 + 1) {
      if ((~(uint)p->pReprs[lVar7] & 0xfffffff) != 0) {
        iVar2 = iVar8 + 1;
        iVar3 = Vec_IntEntry(vTrace_00,iVar8);
        iVar8 = iVar2;
        if (iVar3 != 0) {
          uVar5 = uVar1 + 1;
          pGVar4 = Gia_ManPo(p_00,(uVar1 + p->vCos->nSize) - p->nRegs);
          iVar2 = Gia_ObjFaninLit0p(p_00,pGVar4);
          uVar1 = uVar5;
          if (iVar2 == 0) {
            p->pReprs[lVar7] = (Gia_Rpr_t)((uint)p->pReprs[lVar7] | 0x10000000);
            local_5c = local_5c + 1;
          }
        }
      }
    }
    if (iVar8 != (int)local_38) {
      __assert_fail("nLits == nLitsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x625,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
    }
    if (uVar1 != uVar6) {
      __assert_fail("iLit == nAddPos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x626,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
    }
    Vec_IntFreeP(&vTrace);
  }
  if (fVerbose != 0) {
    Abc_Print(1,"Set %d equivalences as proved.\n",(ulong)local_5c);
  }
LAB_001e7f35:
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManEquivMark( Gia_Man_t * p, char * pFileName, int fSkipSome, int fVerbose )
{
    Gia_Man_t * pMiter, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit, nAddPos, nLits = 0;
    int nLitsAll, Counter = 0;
    nLitsAll = Gia_ManEquivCountLitsAll( p );
    if ( nLitsAll == 0 )
    {
        Abc_Print( 1, "Gia_ManEquivMark(): Current AIG does not have equivalences.\n" );
        return;
    }
    // read AIGER file
    pMiter = Gia_AigerRead( pFileName, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        Abc_Print( 1, "Gia_ManEquivMark(): Input file %s could not be read.\n", pFileName );
        return;
    }
    if ( fSkipSome )
    {
        Vec_Int_t * vTrace = Vec_IntAlloc( 100 );
        pTemp = Gia_ManSpecReduceTrace( p, vTrace, NULL );
        Gia_ManStop( pTemp );
        assert( Vec_IntSize(vTrace) == nLitsAll );
        // count the number of non-zero entries
        nAddPos = 0;
        Vec_IntForEachEntry( vTrace, iLit, i )
            if ( iLit )
                nAddPos++;
        // check the number
        if ( Gia_ManPoNum(pMiter) != Gia_ManPoNum(p) + nAddPos )
        {
            Abc_Print( 1, "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGFilteredEquivNum(%d).\n",
                Gia_ManPoNum(pMiter), Gia_ManPoNum(p), nAddPos );
            Gia_ManStop( pMiter );
            Vec_IntFreeP( &vTrace );
            return;
        }
        // mark corresponding POs as solved
        nLits = iLit = Counter = 0;
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
        {
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                continue;
            if ( Vec_IntEntry( vTrace, nLits++ ) == 0 )
                continue;
            pObj = Gia_ManPo( pMiter, Gia_ManPoNum(p) + iLit++ );
            if ( Gia_ObjFaninLit0p(pMiter, pObj) == 0 ) // const 0 - proven
            {
                Gia_ObjSetProved(p, i);
                Counter++;
            }
        }
        assert( nLits == nLitsAll );
        assert( iLit == nAddPos );
        Vec_IntFreeP( &vTrace );
    }
    else
    {
        if ( Gia_ManPoNum(pMiter) != Gia_ManPoNum(p) + nLitsAll )
        {
            Abc_Print( 1, "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGEquivNum(%d).\n",
                Gia_ManPoNum(pMiter), Gia_ManPoNum(p), nLitsAll );
            Gia_ManStop( pMiter );
            return;
        }
        // mark corresponding POs as solved
        nLits = 0;
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
        {
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                continue;
            pObj = Gia_ManPo( pMiter, Gia_ManPoNum(p) + nLits++ );
            if ( Gia_ObjFaninLit0p(pMiter, pObj) == 0 ) // const 0 - proven
            {
                Gia_ObjSetProved(p, i);
                Counter++;
            }
        }
        assert( nLits == nLitsAll );
    }
    if ( fVerbose )
        Abc_Print( 1, "Set %d equivalences as proved.\n", Counter );
    Gia_ManStop( pMiter );
}